

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  char *pcVar4;
  bool bVar5;
  int local_6c;
  void *pvStack_68;
  int i;
  char **azVals;
  int nCol;
  int callbackIsInit;
  char **azCols;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  char **ppcStack_38;
  int rc;
  char **pzErrMsg_local;
  void *pArg_local;
  sqlite3_callback xCallback_local;
  char *zSql_local;
  sqlite3 *db_local;
  
  zLeftover._4_4_ = 0;
  azCols = (char **)0x0;
  ppcStack_38 = pzErrMsg;
  pzErrMsg_local = (char **)pArg;
  pArg_local = xCallback;
  xCallback_local = (sqlite3_callback)zSql;
  zSql_local = (char *)db;
  iVar1 = sqlite3SafetyCheckOk(db);
  if (iVar1 == 0) {
    db_local._4_4_ = sqlite3MisuseError(0x1b520);
  }
  else {
    if (xCallback_local == (sqlite3_callback)0x0) {
      xCallback_local = (sqlite3_callback)0x47402d;
    }
    sqlite3_mutex_enter(*(sqlite3_mutex **)(zSql_local + 0x18));
    sqlite3Error((sqlite3 *)zSql_local,0);
    while( true ) {
      _nCol = (void *)0x0;
      bVar5 = false;
      if (zLeftover._4_4_ == 0) {
        bVar5 = *xCallback_local != (_func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr)0x0;
      }
      if (!bVar5) break;
      pvStack_68 = (void *)0x0;
      azCols = (char **)0x0;
      zLeftover._4_4_ =
           sqlite3_prepare_v2((sqlite3 *)zSql_local,(char *)xCallback_local,-1,
                              (sqlite3_stmt **)&azCols,(char **)&pStmt);
      if (zLeftover._4_4_ == 0) {
        if (azCols == (char **)0x0) {
          xCallback_local = (sqlite3_callback)pStmt;
        }
        else {
          bVar5 = false;
          iVar1 = sqlite3_column_count((sqlite3_stmt *)azCols);
          do {
            zLeftover._4_4_ = sqlite3_step((sqlite3_stmt *)azCols);
            if ((pArg_local != (void *)0x0) &&
               ((zLeftover._4_4_ == 100 ||
                (((zLeftover._4_4_ == 0x65 && (!bVar5)) &&
                 ((*(uint *)(zSql_local + 0x2c) & 0x100) != 0)))))) {
              if (!bVar5) {
                _nCol = sqlite3DbMallocRaw((sqlite3 *)zSql_local,(long)(iVar1 * 2 + 1) << 3);
                if (_nCol == (void *)0x0) goto LAB_003e281a;
                for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
                  pcVar4 = sqlite3_column_name((sqlite3_stmt *)azCols,local_6c);
                  *(char **)((long)_nCol + (long)local_6c * 8) = pcVar4;
                }
                bVar5 = true;
              }
              if (zLeftover._4_4_ == 100) {
                pvStack_68 = (void *)((long)_nCol + (long)iVar1 * 8);
                for (local_6c = 0; local_6c < iVar1; local_6c = local_6c + 1) {
                  puVar3 = sqlite3_column_text((sqlite3_stmt *)azCols,local_6c);
                  *(uchar **)((long)pvStack_68 + (long)local_6c * 8) = puVar3;
                  if ((*(long *)((long)pvStack_68 + (long)local_6c * 8) == 0) &&
                     (iVar2 = sqlite3_column_type((sqlite3_stmt *)azCols,local_6c), iVar2 != 5)) {
                    sqlite3OomFault((sqlite3 *)zSql_local);
                    goto LAB_003e281a;
                  }
                }
                *(undefined8 *)((long)pvStack_68 + (long)local_6c * 8) = 0;
              }
              iVar2 = (*(code *)pArg_local)(pzErrMsg_local,iVar1,pvStack_68,_nCol);
              if (iVar2 != 0) {
                zLeftover._4_4_ = 4;
                sqlite3VdbeFinalize((Vdbe *)azCols);
                azCols = (char **)0x0;
                sqlite3Error((sqlite3 *)zSql_local,4);
                goto LAB_003e281a;
              }
            }
          } while (zLeftover._4_4_ == 100);
          zLeftover._4_4_ = sqlite3VdbeFinalize((Vdbe *)azCols);
          azCols = (char **)0x0;
          xCallback_local = (sqlite3_callback)pStmt;
          while ((""[(byte)*xCallback_local] & 1) != 0) {
            xCallback_local = xCallback_local + 1;
          }
          sqlite3DbFree((sqlite3 *)zSql_local,_nCol);
        }
      }
    }
LAB_003e281a:
    if (azCols != (char **)0x0) {
      sqlite3VdbeFinalize((Vdbe *)azCols);
    }
    sqlite3DbFree((sqlite3 *)zSql_local,_nCol);
    zLeftover._4_4_ = sqlite3ApiExit((sqlite3 *)zSql_local,zLeftover._4_4_);
    if ((zLeftover._4_4_ == 0) || (ppcStack_38 == (char **)0x0)) {
      if (ppcStack_38 != (char **)0x0) {
        *ppcStack_38 = (char *)0x0;
      }
    }
    else {
      pcVar4 = sqlite3_errmsg((sqlite3 *)zSql_local);
      pcVar4 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar4);
      *ppcStack_38 = pcVar4;
      if (*ppcStack_38 == (char *)0x0) {
        zLeftover._4_4_ = 7;
        sqlite3Error((sqlite3 *)zSql_local,7);
      }
    }
    sqlite3_mutex_leave(*(sqlite3_mutex **)(zSql_local + 0x18));
    db_local._4_4_ = zLeftover._4_4_;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}